

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O2

FxExpression * __thiscall FxUnaryNotBitwise::Resolve(FxUnaryNotBitwise *this,FCompileContext *ctx)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  FxIntCast *this_00;
  undefined4 extraout_var_00;
  FxConstant *this_01;
  ExpVal local_30;
  FxExpression *pFVar3;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  if (this->Operand != (FxExpression *)0x0) {
    iVar1 = (*this->Operand->_vptr_FxExpression[2])();
    pFVar3 = (FxExpression *)CONCAT44(extraout_var,iVar1);
    this->Operand = pFVar3;
    if (pFVar3 != (FxExpression *)0x0) {
      iVar1 = (*(pFVar3->ValueType->super_DObject)._vptr_DObject[0x12])();
      if (iVar1 == 1) {
        this_00 = (FxIntCast *)operator_new(0x40);
        FxIntCast::FxIntCast(this_00,this->Operand);
        this->Operand = (FxExpression *)this_00;
        iVar1 = (*(this_00->super_FxExpression)._vptr_FxExpression[2])(this_00,ctx);
        pFVar3 = (FxExpression *)CONCAT44(extraout_var_00,iVar1);
        this->Operand = pFVar3;
        if (pFVar3 == (FxExpression *)0x0) goto LAB_005d0a1a;
      }
      else {
        pFVar3 = this->Operand;
      }
      iVar1 = (*(pFVar3->ValueType->super_DObject)._vptr_DObject[0x12])();
      if (iVar1 == 0) {
        iVar1 = (*this->Operand->_vptr_FxExpression[3])();
        if ((char)iVar1 == '\0') {
          (this->super_FxExpression).ValueType = (PType *)TypeSInt32;
          return &this->super_FxExpression;
        }
        ExpVal::ExpVal(&local_30,(ExpVal *)(this->Operand + 1));
        uVar2 = ExpVal::GetInt(&local_30);
        ExpVal::~ExpVal(&local_30);
        this_01 = (FxConstant *)operator_new(0x48);
        FxConstant::FxConstant(this_01,~uVar2,&(this->super_FxExpression).ScriptPosition);
      }
      else {
        this_01 = (FxConstant *)0x0;
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,"Integer type expected");
      }
      (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
      return &this_01->super_FxExpression;
    }
  }
LAB_005d0a1a:
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  return (FxExpression *)0x0;
}

Assistant:

FxExpression *FxUnaryNotBitwise::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(Operand, ctx);

	if  (Operand->ValueType->GetRegType() == REGT_FLOAT /* lax */)
	{
		// DECORATE allows floats here so cast them to int.
		Operand = new FxIntCast(Operand);
		Operand = Operand->Resolve(ctx);
		if (Operand == NULL) 
		{
			delete this;
			return NULL;
		}
	}

	if (Operand->ValueType->GetRegType() != REGT_INT)
	{
		ScriptPosition.Message(MSG_ERROR, "Integer type expected");
		delete this;
		return NULL;
	}

	if (Operand->isConstant())
	{
		int result = ~static_cast<FxConstant *>(Operand)->GetValue().GetInt();
		FxExpression *e = new FxConstant(result, ScriptPosition);
		delete this;
		return e;
	}
	ValueType = TypeSInt32;
	return this;
}